

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

int sk_addrtype(SockAddr *addr)

{
  int iVar1;
  int iVar2;
  
  iVar1 = 4;
  if (UNIX < addr->superfamily) {
    if (addr->ais != (addrinfo *)0x0) {
      iVar1 = addr->ais->ai_family;
      iVar2 = 1;
      if (iVar1 != 2) {
        iVar2 = (iVar1 != 10) + 2 + (uint)(iVar1 != 10);
      }
      return iVar2;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int sk_addrtype(SockAddr *addr)
{
    SockAddrStep step;
    int family;
    START_STEP(addr, step);
    family = SOCKADDR_FAMILY(addr, step);

    return (family == AF_INET ? ADDRTYPE_IPV4 :
#ifndef NO_IPV6
            family == AF_INET6 ? ADDRTYPE_IPV6 :
#endif
            ADDRTYPE_NAME);
}